

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

int __thiscall
JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
          (List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this,
          TestObject **item)

{
  int iVar1;
  TestObject *ptr;
  WriteBarrierPtr<TestObject> **ppWVar2;
  int pos;
  TestObject **item_local;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_local;
  
  EnsureArray(this);
  ptr = *item;
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(this->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).
                        buffer);
  Memory::WriteBarrierPtr<TestObject>::operator=
            (*ppWVar2 +
             (this->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count,ptr);
  iVar1 = (this->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count;
  (this->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count =
       (this->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }